

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfXdr.h
# Opt level: O0

void Imf_3_2::Xdr::read<Imf_3_2::StreamIO,Imf_3_2::IStream>(IStream *in,int n,char *v)

{
  char *in_RDX;
  int in_ESI;
  undefined4 in_stack_fffffffffffffff0;
  
  while ((-1 < in_ESI &&
         (StreamIO::readChars((IStream *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,0),
         *in_RDX != '\0'))) {
    in_ESI = in_ESI + -1;
    in_RDX = in_RDX + 1;
  }
  return;
}

Assistant:

void
read (T& in, int n, char v[]) // zero-terminated string
{
    while (n >= 0)
    {
        S::readChars (in, v, 1);

        if (*v == 0) break;

        --n;
        ++v;
    }
}